

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandFraigStore(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtkAdd;
  char *format;
  
  pNtkAdd = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"dh");
  } while (iVar1 == 100);
  if (iVar1 == -1) {
    if (pNtkAdd == (Abc_Ntk_t *)0x0) {
      format = "Empty network.\n";
    }
    else {
      iVar1 = Abc_NtkFraigStore(pNtkAdd);
      if (iVar1 != 0) {
        return 0;
      }
      format = "Fraig storing has failed.\n";
    }
    iVar1 = -1;
  }
  else {
    Abc_Print(-2,"usage: fraig_store [-h]\n");
    Abc_Print(-2,"\t        saves the current network in the AIG database\n");
    format = "\t-h    : print the command usage\n";
    iVar1 = -2;
  }
  Abc_Print(iVar1,format);
  return 1;
}

Assistant:

int Abc_CommandFraigStore( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fDuplicate;

    // set defaults
    fDuplicate = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "dh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'd':
            fDuplicate ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    // get the new network
    if ( !Abc_NtkFraigStore( pNtk ) )
    {
        Abc_Print( -1, "Fraig storing has failed.\n" );
        return 1;
    }
    return 0;

usage:
    Abc_Print( -2, "usage: fraig_store [-h]\n" );
    Abc_Print( -2, "\t        saves the current network in the AIG database\n" );
//    Abc_Print( -2, "\t-d    : toggle duplication of logic [default = %s]\n", fDuplicate? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}